

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

shared_ptr<minja::Expression> __thiscall minja::Parser::parseValueExpression(Parser *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  runtime_error *prVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  Expression *__tmp_3;
  Expression *__tmp;
  SliceExpr *this_00;
  Parser *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  long lVar17;
  char *pcVar18;
  long *plVar19;
  char *pcVar20;
  shared_ptr<minja::Expression> sVar21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  Location location;
  shared_ptr<minja::VariableExpr> identifier;
  shared_ptr<minja::Expression> slice_start;
  shared_ptr<minja::Expression> slice_end;
  anon_class_8_1_8991fb9c parseValue;
  allocator_type local_159;
  string local_158;
  Parser *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  data local_c8;
  allocator_type local_b1;
  long **local_b0;
  _func_int **local_a8;
  _func_int **local_a0;
  _func_int **local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70 [2];
  long local_60 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  parseValueExpression::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
  local_b0 = local_70;
  local_a0 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261d68;
  local_a8 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261c30;
  local_98 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261cc0;
  local_130 = this;
  do {
    pcVar4 = (in_RSI->end)._M_current;
    pcVar20 = (in_RSI->it)._M_current;
    pcVar18 = pcVar20;
    if (pcVar20 == pcVar4) {
      bVar10 = false;
    }
    else {
      do {
        iVar12 = isspace((int)*pcVar18);
        if (iVar12 == 0) break;
        pcVar18 = pcVar18 + 1;
        (in_RSI->it)._M_current = pcVar18;
      } while (pcVar18 != pcVar4);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,".","");
      __l._M_len = 2;
      __l._M_array = &local_90;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_50,__l,&local_b1);
      bVar10 = peekSymbols(in_RSI,&local_50);
    }
    if (pcVar20 != pcVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50);
      lVar17 = -0x40;
      plVar19 = local_60;
      do {
        if (plVar19 != (long *)plVar19[-2]) {
          operator_delete((long *)plVar19[-2],*plVar19 + 1);
        }
        plVar19 = plVar19 + -4;
        lVar17 = lVar17 + 0x20;
        this = local_130;
      } while (lVar17 != 0);
    }
    if (bVar10 == false) {
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"(","");
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_108;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_158,__l_02,(allocator_type *)local_128);
      bVar10 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158);
      _Var15._M_pi = extraout_RDX;
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        _Var15._M_pi = extraout_RDX_00;
      }
      if (bVar10) {
        local_158._M_dataplus._M_p =
             (pointer)(in_RSI->template_str).
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        local_158._M_string_length =
             (size_type)
             (in_RSI->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158._M_string_length)->_M_use_count + 1;
          }
        }
        local_158.field_2._M_allocated_capacity =
             (long)(in_RSI->it)._M_current - (long)(in_RSI->start)._M_current;
        parseCallArgs((ArgumentsExpression *)local_108,in_RSI);
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var13->_M_use_count = 1;
        p_Var13->_M_weak_count = 1;
        p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261e18;
        CallExpr::CallExpr((CallExpr *)(p_Var13 + 1),(Location *)&local_158,
                           (shared_ptr<minja::Expression> *)this,(ArgumentsExpression *)local_108);
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(p_Var13 + 1);
        p_Var16 = (this->template_str).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var13;
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                   *)(local_108 + 0x18));
        std::
        vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
        ::~vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                   *)local_108);
        _Var15._M_pi = extraout_RDX_01;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
          _Var15._M_pi = extraout_RDX_02;
        }
      }
      sVar21.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var15._M_pi;
      sVar21.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<minja::Expression>)
             sVar21.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    paVar2 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"[","");
    pcVar3 = local_108 + 0x10;
    consumeToken((string *)local_108,in_RSI,&local_158,Strip);
    uVar7 = local_108._8_8_;
    if ((pointer)local_108._0_8_ != pcVar3) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,".","");
      consumeToken((string *)local_108,in_RSI,&local_158,Strip);
      uVar7 = local_108._8_8_;
      if ((pointer)local_108._0_8_ != pcVar3) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        parseIdentifier((Parser *)local_128);
        if ((SliceExpr *)local_128._0_8_ == (SliceExpr *)0x0) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar14,"Expected identifier in subscript");
          __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar4 = (in_RSI->end)._M_current;
        pcVar20 = (in_RSI->it)._M_current;
        while ((pcVar20 != pcVar4 && (iVar12 = isspace((int)*pcVar20), iVar12 != 0))) {
          pcVar20 = pcVar20 + 1;
          (in_RSI->it)._M_current = pcVar20;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"(","");
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_108;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_158,__l_00,(allocator_type *)local_118);
        bVar10 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_158);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        uVar7 = local_128._0_8_;
        if (!bVar10) {
          peVar5 = (((shared_ptr<minja::Expression> *)(local_128._0_8_ + 0x20))->
                   super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_158._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,peVar5,
                     (long)&((((shared_ptr<minja::Expression> *)(local_128._0_8_ + 0x20))->
                             super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar5);
          Value::Value((Value *)local_108,&local_158);
          local_118._0_8_ = (SliceExpr *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<minja::LiteralExpr,std::allocator<minja::LiteralExpr>,minja::Location&,minja::Value>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                     (LiteralExpr **)local_118,(allocator<minja::LiteralExpr> *)&local_159,
                     &((Expression *)uVar7)->location,(Value *)local_108);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_c8,false);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_c8);
          if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
          }
          if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_108._8_8_ + 0xc);
              iVar12 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar12 = *(_Atomic_word *)(local_108._8_8_ + 0xc);
              *(int *)(local_108._8_8_ + 0xc) = iVar12 + -1;
            }
            if (iVar12 == 1) {
              (**(code **)(*(long *)local_108._8_8_ + 0x18))();
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          local_108._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<minja::SubscriptExpr,std::allocator<minja::SubscriptExpr>,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::LiteralExpr>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                     (SubscriptExpr **)local_108,(allocator<minja::SubscriptExpr> *)&local_158,
                     &((Expression *)local_128._0_8_)->location,
                     (shared_ptr<minja::Expression> *)this,
                     (shared_ptr<minja::LiteralExpr> *)local_118);
          uVar8 = local_108._8_8_;
          uVar7 = local_108._0_8_;
          local_108._0_8_ = (pointer)0x0;
          local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var16 = (this->template_str).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (this->template_str).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar7;
          (this->template_str).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
          }
          goto LAB_001e30d5;
        }
        parseCallArgs((ArgumentsExpression *)local_108,in_RSI);
        uVar7 = local_128._0_8_;
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
        p_Var13->_M_use_count = 1;
        p_Var13->_M_weak_count = 1;
        p_Var13->_vptr__Sp_counted_base = local_a0;
        MethodCallExpr::MethodCallExpr
                  ((MethodCallExpr *)(p_Var13 + 1),&((Expression *)uVar7)->location,
                   (shared_ptr<minja::Expression> *)this,
                   (shared_ptr<minja::VariableExpr> *)local_128,(ArgumentsExpression *)local_108);
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(p_Var13 + 1);
        p_Var16 = (this->template_str).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var13;
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                   *)(local_108 + 0x18));
        std::
        vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
        ::~vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                   *)local_108);
        goto LAB_001e30df;
      }
    }
    else {
      local_128._0_8_ = (element_type *)0x0;
      local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,":","");
      consumeToken((string *)local_108,in_RSI,&local_158,Strip);
      uVar7 = local_108._8_8_;
      if ((pointer)local_108._0_8_ != pcVar3) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      bVar10 = SUB81(in_RSI,0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        parseExpression((Parser *)local_118,bVar10);
        local_158._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,":","");
        consumeToken((string *)local_108,in_RSI,&local_158,Strip);
        uVar7 = local_108._8_8_;
        if ((pointer)local_108._0_8_ != pcVar3) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_118._8_8_;
        uVar8 = local_118._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_118._0_8_ = (SliceExpr *)0x0;
          local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_;
          local_128._0_8_ = uVar8;
          local_128._8_8_ = uVar9;
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        }
        else {
          pcVar4 = (in_RSI->end)._M_current;
          pcVar20 = (in_RSI->it)._M_current;
          while ((pcVar20 != pcVar4 && (iVar12 = isspace((int)*pcVar20), iVar12 != 0))) {
            pcVar20 = pcVar20 + 1;
            (in_RSI->it)._M_current = pcVar20;
          }
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"]","");
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_108;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_158,__l_01,&local_159);
          bVar11 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_158);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_158);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          if (bVar11) {
            local_158._M_dataplus._M_p = (pointer)0x0;
            local_108._0_8_ = (SliceExpr *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<minja::SliceExpr,std::allocator<minja::SliceExpr>,minja::Location&,std::shared_ptr<minja::Expression>,decltype(nullptr)>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                       (SliceExpr **)local_108,(allocator<minja::SliceExpr> *)&local_159,
                       (Location *)(local_118._0_8_ + 8),(shared_ptr<minja::Expression> *)local_118,
                       (void **)&local_158);
            uVar8 = local_108._8_8_;
            local_128._0_8_ = local_108._0_8_;
            uVar7 = local_128._8_8_;
            local_108._0_8_ = (pointer)0x0;
            local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_128._8_8_ = uVar8;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
              p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
            }
          }
          else {
            parseExpression((Parser *)local_108,bVar10);
            uVar7 = local_118._0_8_;
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
            p_Var13->_M_use_count = 1;
            p_Var13->_M_weak_count = 1;
            p_Var13->_vptr__Sp_counted_base = local_a8;
            this_00 = (SliceExpr *)(p_Var13 + 1);
            SliceExpr::SliceExpr
                      (this_00,(Location *)(uVar7 + 8),(shared_ptr<minja::Expression> *)local_118,
                       (shared_ptr<minja::Expression> *)local_108);
            uVar7 = local_128._8_8_;
            bVar10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
            local_128._0_8_ = this_00;
            local_128._8_8_ = p_Var13;
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
            if (bVar10) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
              p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
            }
          }
        }
        local_118._8_8_ = p_Var13;
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        }
      }
      else {
        parseExpression((Parser *)local_108,bVar10);
        local_118._0_8_ = (SliceExpr *)0x0;
        local_158._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<minja::SliceExpr,std::allocator<minja::SliceExpr>,minja::Location&,decltype(nullptr),std::shared_ptr<minja::Expression>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length,
                   (SliceExpr **)&local_158,(allocator<minja::SliceExpr> *)&local_159,
                   (Location *)(local_108._0_8_ + 8),(void **)local_118,
                   (shared_ptr<minja::Expression> *)local_108);
        uVar7 = local_128._8_8_;
        local_128._8_8_ = local_158._M_string_length;
        local_128._0_8_ = local_158._M_dataplus._M_p;
        local_158._M_dataplus._M_p = (pointer)0x0;
        local_158._M_string_length = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
        }
      }
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      if ((SliceExpr *)local_128._0_8_ == (SliceExpr *)0x0) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar14,"Empty index in subscript");
        goto LAB_001e332f;
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"]","");
      consumeToken((string *)local_108,in_RSI,&local_158,Strip);
      uVar7 = local_108._8_8_;
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar14,"Expected closing bracket in subscript");
LAB_001e332f:
        __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      peVar6 = (this->template_str).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var13->_M_use_count = 1;
      p_Var13->_M_weak_count = 1;
      p_Var13->_vptr__Sp_counted_base = local_98;
      SubscriptExpr::SubscriptExpr
                ((SubscriptExpr *)(p_Var13 + 1),(Location *)&peVar6->_M_string_length,
                 (shared_ptr<minja::Expression> *)this,(shared_ptr<minja::Expression> *)local_128);
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)(p_Var13 + 1);
      p_Var16 = (this->template_str).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var13;
LAB_001e30d5:
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
LAB_001e30df:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
    }
    pcVar4 = (in_RSI->end)._M_current;
    pcVar20 = (in_RSI->it)._M_current;
    while ((pcVar20 != pcVar4 && (iVar12 = isspace((int)*pcVar20), iVar12 != 0))) {
      pcVar20 = pcVar20 + 1;
      (in_RSI->it)._M_current = pcVar20;
    }
  } while( true );
}

Assistant:

std::shared_ptr<Expression> parseValueExpression() {
      auto parseValue = [&]() -> std::shared_ptr<Expression> {
        auto location = get_location();
        auto constant = parseConstant();
        if (constant) return std::make_shared<LiteralExpr>(location, *constant);

        static std::regex null_regex(R"(null\b)");
        if (!consumeToken(null_regex).empty()) return std::make_shared<LiteralExpr>(location, Value());

        auto identifier = parseIdentifier();
        if (identifier) return identifier;

        auto braced = parseBracedExpressionOrArray();
        if (braced) return braced;

        auto array = parseArray();
        if (array) return array;

        auto dictionary = parseDictionary();
        if (dictionary) return dictionary;

        throw std::runtime_error("Expected value expression");
      };

      auto value = parseValue();

      while (it != end && consumeSpaces() && peekSymbols({ "[", "." })) {
        if (!consumeToken("[").empty()) {
            std::shared_ptr<Expression> index;
            if (!consumeToken(":").empty()) {
              auto slice_end = parseExpression();
              index = std::make_shared<SliceExpr>(slice_end->location, nullptr, std::move(slice_end));
            } else {
              auto slice_start = parseExpression();
              if (!consumeToken(":").empty()) {
                consumeSpaces();
                if (peekSymbols({ "]" })) {
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), nullptr);
                } else {
                  auto slice_end = parseExpression();
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), std::move(slice_end));
                }
              } else {
                index = std::move(slice_start);
              }
            }
            if (!index) throw std::runtime_error("Empty index in subscript");
            if (consumeToken("]").empty()) throw std::runtime_error("Expected closing bracket in subscript");

            value = std::make_shared<SubscriptExpr>(value->location, std::move(value), std::move(index));
        } else if (!consumeToken(".").empty()) {
            auto identifier = parseIdentifier();
            if (!identifier) throw std::runtime_error("Expected identifier in subscript");

            consumeSpaces();
            if (peekSymbols({ "(" })) {
              auto callParams = parseCallArgs();
              value = std::make_shared<MethodCallExpr>(identifier->location, std::move(value), std::move(identifier), std::move(callParams));
            } else {
              auto key = std::make_shared<LiteralExpr>(identifier->location, Value(identifier->get_name()));
              value = std::make_shared<SubscriptExpr>(identifier->location, std::move(value), std::move(key));
            }
        }
        consumeSpaces();
      }

      if (peekSymbols({ "(" })) {
        auto location = get_location();
        auto callParams = parseCallArgs();
        value = std::make_shared<CallExpr>(location, std::move(value), std::move(callParams));
      }
      return value;
    }